

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pca.hpp
# Opt level: O0

void PCA::run_pca(pca_params *params,vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *v_input,
                 vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *v_output)

{
  size_type sVar1;
  const_reference ppgVar2;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *in_RDX;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *in_RSI;
  long in_RDI;
  ggml_tensor *ctrl_out;
  size_t il;
  ggml_tensor *in_stack_000000a0;
  ggml_tensor *in_stack_000000a8;
  pca_params *in_stack_000000b0;
  ulong local_20;
  
  printf("%s: Running PCA...\n","run_pca");
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::size(in_RSI);
    if (sVar1 <= local_20) break;
    ppgVar2 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                        (in_RDX,local_20);
    ggml_format_name(*ppgVar2,"direction.%zu",local_20 + 1);
    *(int *)(in_RDI + 0x10) = (int)local_20;
    sVar1 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::size(in_RSI);
    *(int *)(in_RDI + 0x14) = (int)sVar1;
    std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[](in_RSI,local_20);
    power_iteration(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
    sVar1 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::size(in_RSI);
    printf("%s: Done layer %d / %d\n","run_pca",(ulong)((int)local_20 + 1),sVar1 & 0xffffffff);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

static void run_pca(
        struct pca_params & params,
        const std::vector<struct ggml_tensor *> & v_input, // shape of v_input[0]: [n_samples, n_embd]
        const std::vector<struct ggml_tensor *> & v_output) {
    printf("%s: Running PCA...\n", __func__);
    for (size_t il = 0; il < v_input.size(); ++il) {

        // prepare output vector
        struct ggml_tensor * ctrl_out = v_output[il];
        ggml_format_name(ctrl_out, "direction.%zu", il+1);

        // run power_iteration
        params.i_layer = il;
        params.n_layers = v_input.size();
        power_iteration(params, v_input[il], ctrl_out);
        printf("%s: Done layer %d / %d\n", __func__, (int) il+1, (int) v_input.size());
    }
}